

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_28eba0::ArgParser::argOverlay(ArgParser *this)

{
  allocator<char> local_41;
  string local_40;
  shared_ptr<QPDFJob::UOConfig> local_20;
  ArgParser *local_10;
  ArgParser *this_local;
  
  local_10 = this;
  std::__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->c_main);
  QPDFJob::Config::overlay((Config *)&local_20);
  std::shared_ptr<QPDFJob::UOConfig>::operator=(&this->c_uo,&local_20);
  std::shared_ptr<QPDFJob::UOConfig>::~shared_ptr(&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"underlay/overlay",&local_41);
  QPDFArgParser::selectOptionTable(&this->ap,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void
ArgParser::argOverlay()
{
    this->c_uo = c_main->overlay();
    this->ap.selectOptionTable(O_UNDERLAY_OVERLAY);
}